

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void fio_state_callback_add(callback_type_e c_type,_func_void_void_ptr *func,void *arg)

{
  fio_ls_embd_s *pfVar1;
  int *piVar2;
  fio_ls_embd_s *local_48;
  fio_ls_embd_s *local_40;
  void *local_38;
  callback_data_s *local_30;
  fio_ls_embd_s *local_28;
  callback_data_s *tmp;
  void *arg_local;
  _func_void_void_ptr *func_local;
  callback_type_e c_type_local;
  
  tmp = (callback_data_s *)arg;
  arg_local = func;
  func_local._4_4_ = c_type;
  if ((c_type == FIO_CALL_ON_INITIALIZE) && (fio_data != (fio_data_s *)0x0)) {
    (*func)(arg);
  }
  else if ((func != (_func_void_void_ptr *)0x0) &&
          ((-1 < (int)c_type && (c_type < (FIO_CALL_AT_EXIT|FIO_CALL_BEFORE_FORK))))) {
    fio_lock(&callback_collection[c_type].lock);
    fio_state_callback_ensure(callback_collection + func_local._4_4_);
    pfVar1 = (fio_ls_embd_s *)malloc(0x20);
    local_28 = pfVar1;
    if (pfVar1 == (fio_ls_embd_s *)0x0) {
      if (0 < FIO_LOG_LEVEL) {
        FIO_LOG2STDERR(
                      "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fio.c:3334"
                      );
      }
      kill(0,2);
      piVar2 = __errno_location();
      exit(*piVar2);
    }
    memset(&local_48,0,0x10);
    local_38 = arg_local;
    local_30 = tmp;
    pfVar1->prev = local_48;
    pfVar1->next = local_40;
    pfVar1[1].prev = (fio_ls_embd_s *)arg_local;
    pfVar1[1].next = &tmp->node;
    fio_ls_embd_push(&callback_collection[func_local._4_4_].callbacks,local_28);
    fio_unlock(&callback_collection[func_local._4_4_].lock);
  }
  return;
}

Assistant:

void fio_state_callback_add(callback_type_e c_type, void (*func)(void *),
                            void *arg) {
  if (c_type == FIO_CALL_ON_INITIALIZE && fio_data) {
    func(arg);
    return;
  }
  if (!func || (int)c_type < 0 || c_type > FIO_CALL_NEVER)
    return;
  fio_lock(&callback_collection[c_type].lock);
  fio_state_callback_ensure(&callback_collection[c_type]);
  callback_data_s *tmp = malloc(sizeof(*tmp));
  FIO_ASSERT_ALLOC(tmp);
  *tmp = (callback_data_s){.func = func, .arg = arg};
  fio_ls_embd_push(&callback_collection[c_type].callbacks, &tmp->node);
  fio_unlock(&callback_collection[c_type].lock);
}